

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

ktx_error_code_e
ktxTexture_CreateFromNamedFile(char *filename,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  FILE *file;
  ktxStream stream;
  
  if (newTex == (ktxTexture **)0x0 || filename == (char *)0x0) {
    return KTX_INVALID_VALUE;
  }
  file = fopen(filename,"rb");
  if (file == (FILE *)0x0) {
    kVar1 = KTX_FILE_OPEN_FAILED;
  }
  else {
    kVar1 = ktxFileStream_construct(&stream,(FILE *)file,true);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxTexture_CreateFromStream(&stream,createFlags,newTex);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromNamedFile(const char* const filename,
                               ktxTextureCreateFlags createFlags,
                               ktxTexture** newTex)
{
    KTX_error_code result;
    ktxStream stream;
    FILE* file;

    if (filename == NULL || newTex == NULL)
        return KTX_INVALID_VALUE;

    file = ktxFOpenUTF8(filename, "rb");
    if (!file)
       return KTX_FILE_OPEN_FAILED;

    result = ktxFileStream_construct(&stream, file, KTX_TRUE);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;
}